

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

size_t bitset_extract_setbits(uint64_t *words,size_t length,uint32_t *out,uint32_t base)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  uint32_t val;
  int r;
  uint64_t w;
  size_t i;
  int outpos;
  undefined8 local_30;
  undefined8 local_28;
  undefined4 local_20;
  undefined4 local_1c;
  
  local_20 = 0;
  local_1c = in_ECX;
  for (local_28 = 0; local_28 < in_RSI; local_28 = local_28 + 1) {
    for (local_30 = *(unsigned_long_long *)(in_RDI + local_28 * 8); local_30 != 0;
        local_30 = local_30 - 1 & local_30) {
      iVar1 = roaring_trailing_zeroes(local_30);
      *(int *)(in_RDX + (long)local_20 * 4) = iVar1 + local_1c;
      local_20 = local_20 + 1;
    }
    local_1c = local_1c + 0x40;
  }
  return (long)local_20;
}

Assistant:

size_t bitset_extract_setbits(const uint64_t *words, size_t length,
                              uint32_t *out, uint32_t base) {
    int outpos = 0;
    for (size_t i = 0; i < length; ++i) {
        uint64_t w = words[i];
        while (w != 0) {
            int r =
                roaring_trailing_zeroes(w);  // on x64, should compile to TZCNT
            uint32_t val = r + base;
            memcpy(out + outpos, &val,
                   sizeof(uint32_t));  // should be compiled as a MOV on x64
            outpos++;
            w &= (w - 1);
        }
        base += 64;
    }
    return outpos;
}